

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_setup_connection(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  CURLcode CVar2;
  FILEPROTO *pFVar3;
  
  pFVar3 = (FILEPROTO *)(*Curl_ccalloc)(0x50,1);
  (data->req).p.file = pFVar3;
  if (pFVar3 == (FILEPROTO *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    puVar1 = &(conn->bits).field_0x8;
    *puVar1 = *puVar1 & 0xfe;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode imap_setup_connection(struct Curl_easy *data,
                                      struct connectdata *conn)
{
  /* Initialise the IMAP layer */
  CURLcode result = imap_init(data);
  if(result)
    return result;

  /* Clear the TLS upgraded flag */
  conn->bits.tls_upgraded = FALSE;

  return CURLE_OK;
}